

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O0

int rpm_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int *piVar1;
  int bits_checked;
  ssize_t avail;
  uchar *b;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  b = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  piVar1 = (int *)__archive_read_filter_ahead(filter,8,(ssize_t *)&stack0xffffffffffffffd0);
  if (piVar1 == (int *)0x0) {
    self_local._4_4_ = 0;
  }
  else if (*piVar1 == -0x24115413) {
    if (((char)piVar1[1] == '\x03') || ((char)piVar1[1] == '\x04')) {
      if (*(char *)((long)piVar1 + 6) == '\0') {
        if ((*(char *)((long)piVar1 + 7) == '\0') || (*(char *)((long)piVar1 + 7) == '\x01')) {
          self_local._4_4_ = 0x38;
        }
        else {
          self_local._4_4_ = 0;
        }
      }
      else {
        self_local._4_4_ = 0;
      }
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  else {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int
rpm_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 8, &avail);
	if (b == NULL)
		return (0);

	bits_checked = 0;
	/*
	 * Verify Header Magic Bytes : 0XED 0XAB 0XEE 0XDB
	 */
	if (memcmp(b, "\xED\xAB\xEE\xDB", 4) != 0)
		return (0);
	bits_checked += 32;
	/*
	 * Check major version.
	 */
	if (b[4] != 3 && b[4] != 4)
		return (0);
	bits_checked += 8;
	/*
	 * Check package type; binary or source.
	 */
	if (b[6] != 0)
		return (0);
	bits_checked += 8;
	if (b[7] != 0 && b[7] != 1)
		return (0);
	bits_checked += 8;

	return (bits_checked);
}